

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O2

bool __thiscall BamTools::PropertyFilterValue::check<float>(PropertyFilterValue *this,float *query)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  float *pfVar4;
  char *pcVar5;
  bool bVar6;
  
  bVar2 = Variant::is_type<float>(&this->Value);
  if (!bVar2) {
    pcVar5 = "Cannot compare different types!";
LAB_00172431:
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_00172440:
    return false;
  }
  bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
  if (bVar2) {
    pcVar5 = "Cannot compare different types - query is a string!";
    goto LAB_00172431;
  }
  switch(this->Type) {
  case EXACT:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = fVar1 == *pfVar4;
    break;
  case GREATER_THAN:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = fVar1 == *pfVar4;
    bVar6 = fVar1 < *pfVar4;
    goto LAB_00172502;
  case GREATER_THAN_EQUAL:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = fVar1 < *pfVar4;
    goto LAB_001724c0;
  case LESS_THAN:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = *pfVar4 == fVar1;
    bVar6 = *pfVar4 < fVar1;
LAB_00172502:
    return !bVar6 && !bVar2;
  case LESS_THAN_EQUAL:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = *pfVar4 < fVar1;
LAB_001724c0:
    return !bVar2;
  case NOT:
    fVar1 = *query;
    pfVar4 = Variant::get<float>(&this->Value);
    bVar2 = fVar1 != *pfVar4;
    break;
  default:
    goto LAB_00172440;
  }
  return (bool)(-bVar2 & 1);
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}